

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O0

void wasm::OptUtils::optimizeAfterInlining(FuncSet *funcs,Module *module,PassRunner *parentRunner)

{
  bool bVar1;
  int iVar2;
  Fatal local_448;
  WasmValidator local_2b9;
  undefined1 local_2b8 [8];
  FilteredPassRunner runner;
  Fatal local_1b0;
  WasmValidator local_21;
  PassRunner *local_20;
  PassRunner *parentRunner_local;
  Module *module_local;
  FuncSet *funcs_local;
  
  local_20 = parentRunner;
  parentRunner_local = (PassRunner *)module;
  module_local = (Module *)funcs;
  iVar2 = PassRunner::getPassDebug();
  if ((1 < iVar2) &&
     (bVar1 = WasmValidator::validate(&local_21,(Module *)parentRunner_local,&local_20->options),
     ((bVar1 ^ 0xffU) & 1) != 0)) {
    Fatal::Fatal(&local_1b0);
    Fatal::operator<<(&local_1b0,(char (*) [42])"invalid wasm before optimizeAfterInlining");
    Fatal::~Fatal(&local_1b0);
  }
  PassUtils::FilteredPassRunner::FilteredPassRunner
            ((FilteredPassRunner *)local_2b8,(Module *)parentRunner_local,(FuncSet *)module_local,
             &local_20->options);
  PassRunner::setIsNested((PassRunner *)local_2b8,true);
  addUsefulPassesAfterInlining((PassRunner *)local_2b8);
  PassRunner::run((PassRunner *)local_2b8);
  iVar2 = PassRunner::getPassDebug();
  if ((1 < iVar2) &&
     (bVar1 = WasmValidator::validate(&local_2b9,(Module *)parentRunner_local,&local_20->options),
     ((bVar1 ^ 0xffU) & 1) != 0)) {
    Fatal::Fatal(&local_448);
    Fatal::operator<<(&local_448,(char (*) [41])"invalid wasm after optimizeAfterInlining");
    Fatal::~Fatal(&local_448);
  }
  PassUtils::FilteredPassRunner::~FilteredPassRunner((FilteredPassRunner *)local_2b8);
  return;
}

Assistant:

inline void optimizeAfterInlining(const PassUtils::FuncSet& funcs,
                                  Module* module,
                                  PassRunner* parentRunner) {
  // In pass-debug mode, validate before and after these optimizations. This
  // helps catch bugs in the middle of passes like inlining and dae. We do this
  // at level 2+ and not 1 so that this extra validation is not added to the
  // timings that level 1 reports.
  if (PassRunner::getPassDebug() >= 2) {
    if (!WasmValidator().validate(*module, parentRunner->options)) {
      Fatal() << "invalid wasm before optimizeAfterInlining";
    }
  }
  PassUtils::FilteredPassRunner runner(module, funcs, parentRunner->options);
  runner.setIsNested(true);
  addUsefulPassesAfterInlining(runner);
  runner.run();
  if (PassRunner::getPassDebug() >= 2) {
    if (!WasmValidator().validate(*module, parentRunner->options)) {
      Fatal() << "invalid wasm after optimizeAfterInlining";
    }
  }
}